

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NamedBlockClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedBlockClauseSyntax,slang::syntax::NamedBlockClauseSyntax_const&>
          (BumpAllocator *this,NamedBlockClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  NamedBlockClauseSyntax *pNVar13;
  
  pNVar13 = (NamedBlockClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedBlockClauseSyntax *)this->endPtr < pNVar13 + 1) {
    pNVar13 = (NamedBlockClauseSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pNVar13 + 1);
  }
  (pNVar13->name).info = (args->name).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->colon).kind;
  uVar8 = (args->colon).field_0x2;
  NVar9.raw = (args->colon).numFlags.raw;
  uVar10 = (args->colon).rawLen;
  TVar3 = (args->name).kind;
  uVar4 = (args->name).field_0x2;
  NVar5.raw = (args->name).numFlags.raw;
  uVar6 = (args->name).rawLen;
  (pNVar13->colon).info = (args->colon).info;
  (pNVar13->name).kind = TVar3;
  (pNVar13->name).field_0x2 = uVar4;
  (pNVar13->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pNVar13->name).rawLen = uVar6;
  (pNVar13->super_SyntaxNode).previewNode = pSVar2;
  (pNVar13->colon).kind = TVar7;
  (pNVar13->colon).field_0x2 = uVar8;
  (pNVar13->colon).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar13->colon).rawLen = uVar10;
  (pNVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pNVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pNVar13->super_SyntaxNode).parent = pSVar1;
  return pNVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }